

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<SDL_Surface*>>,std::tuple<SDL_Surface*>>
               (tuple<testing::Matcher<SDL_Surface_*>_> *matchers,tuple<SDL_Surface_*> *values,
               ostream *os)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<Matcher<SDL_Surface_*>_>_> *p_Var2;
  ostream *poVar3;
  MatcherBase<SDL_Surface_*> *this;
  string local_208;
  undefined1 local_1d8 [8];
  StringMatchResultListener listener;
  Value *value;
  type matcher;
  ostream *os_local;
  tuple<SDL_Surface_*> *values_local;
  tuple<testing::Matcher<SDL_Surface_*>_> *matchers_local;
  
  matcher.super_MatcherBase<SDL_Surface_*>.buffer_ = (Buffer)os;
  TuplePrefix<0ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<SDL_Surface*>>,std::tuple<SDL_Surface*>>
            (matchers,values,os);
  p_Var2 = std::get<0ul,testing::Matcher<SDL_Surface*>>(matchers);
  Matcher<SDL_Surface_*>::Matcher((Matcher<SDL_Surface_*> *)&value,p_Var2);
  listener._400_8_ = std::get<0ul,SDL_Surface*>(values);
  StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1d8);
  bVar1 = MatcherBase<SDL_Surface_*>::MatchAndExplain
                    ((MatcherBase<SDL_Surface_*> *)&value,(SDL_Surface **)listener._400_8_,
                     (MatchResultListener *)local_1d8);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)matcher.super_MatcherBase<SDL_Surface_*>.buffer_.shared,
                             "  Expected arg #");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
    std::operator<<(poVar3,": ");
    this = &std::get<0ul,testing::Matcher<SDL_Surface*>>(matchers)->super_MatcherBase<SDL_Surface_*>
    ;
    MatcherBase<SDL_Surface_*>::DescribeTo
              (this,(ostream *)matcher.super_MatcherBase<SDL_Surface_*>.buffer_.shared);
    std::operator<<((ostream *)matcher.super_MatcherBase<SDL_Surface_*>.buffer_.shared,
                    "\n           Actual: ");
    UniversalPrint<SDL_Surface*>
              ((SDL_Surface **)listener._400_8_,
               (ostream *)matcher.super_MatcherBase<SDL_Surface_*>.buffer_.shared);
    StringMatchResultListener::str_abi_cxx11_(&local_208,(StringMatchResultListener *)local_1d8);
    PrintIfNotEmpty(&local_208,(ostream *)matcher.super_MatcherBase<SDL_Surface_*>.buffer_.shared);
    std::__cxx11::string::~string((string *)&local_208);
    std::operator<<((ostream *)matcher.super_MatcherBase<SDL_Surface_*>.buffer_.shared,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1d8);
  Matcher<SDL_Surface_*>::~Matcher((Matcher<SDL_Surface_*> *)&value);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }